

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint local_a0;
  byte local_9a;
  allocator local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string var;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  string *varIPO;
  
  var.field_2._8_8_ = config;
  iVar2 = GetType(this);
  switch(iVar2) {
  case 0:
    std::operator+(&local_100,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_100,"_LINK_EXECUTABLE");
    std::__cxx11::string::~string((string *)&local_100);
    break;
  case 1:
    std::operator+(&local_68,"CMAKE_",lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"_CREATE_STATIC_LIBRARY");
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"INTERPROCEDURAL_OPTIMIZATION",&local_99);
    bVar1 = GetFeatureAsBool(this,&local_98,(string *)var.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    if (bVar1) {
      local_9a = 0;
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "_IPO");
      pcVar3 = cmMakefile::GetDefinition(this->Makefile,__return_storage_ptr__);
      if (pcVar3 != (char *)0x0) {
        local_9a = 1;
      }
      local_a0 = (uint)(pcVar3 != (char *)0x0);
      if ((local_9a & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      if (local_a0 == 0) goto LAB_005db4e1;
    }
    else {
LAB_005db4e1:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      local_a0 = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
    break;
  case 2:
    std::operator+(&local_c0,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_c0,"_CREATE_SHARED_LIBRARY");
    std::__cxx11::string::~string((string *)&local_c0);
    break;
  case 3:
    std::operator+(&local_e0,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_e0,"_CREATE_SHARED_MODULE");
    std::__cxx11::string::~string((string *)&local_e0);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_101);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetCreateRuleVariable(std::string const& lang,
                                         std::string const& config) const
{
  switch(this->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      if(this->GetFeatureAsBool(
           "INTERPROCEDURAL_OPTIMIZATION", config))
        {
        std::string varIPO = var + "_IPO";
        if(this->Makefile->GetDefinition(varIPO))
          {
          return varIPO;
          }
        }
      return var;
      }
    case cmTarget::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmTarget::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmTarget::EXECUTABLE:
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
    }
  return "";
}